

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O1

int __thiscall HSet::remove(HSet *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  undefined8 unaff_RBP;
  
  bVar1 = this->setup_;
  if (bVar1 == false) {
    setup(this,1,0,false,(FILE *)0x0,false,true);
    if (this->debug_ == false) {
      return 0;
    }
  }
  else {
    if ((int)__filename < 0) {
      return 0;
    }
    if (this->max_entry_ < (int)__filename) {
      return 0;
    }
    piVar4 = (this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar4[(ulong)__filename & 0xffffffff];
    lVar6 = (long)iVar2;
    if (lVar6 == -1) {
      return (uint)(lVar6 != -1);
    }
    piVar4[(ulong)__filename & 0xffffffff] = -1;
    if (iVar2 < this->count_ + -1) {
      piVar5 = (this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = piVar5[(long)this->count_ + -1];
      piVar5[lVar6] = iVar3;
      piVar4[iVar3] = iVar2;
    }
    this->count_ = this->count_ + -1;
    if (this->debug_ != true) {
      return 1;
    }
  }
  debug(this);
  return (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar1);
}

Assistant:

bool HSet::remove(const HighsInt entry) {
  if (!setup_) {
    setup(1, 0);
    if (debug_) debug();
    return false;
  }
  if (entry < min_entry) return false;
  if (entry > max_entry_) return false;
  HighsInt pointer = pointer_[entry];
  if (pointer == no_pointer) return false;
  pointer_[entry] = no_pointer;
  if (pointer < count_ - 1) {
    HighsInt last_entry = entry_[count_ - 1];
    entry_[pointer] = last_entry;
    pointer_[last_entry] = pointer;
  }
  count_--;
  if (debug_) debug();
  return true;
}